

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
CheckContext(JsrtContext *currentContext,bool verifyRuntimeState,
            bool allowInObjectBeforeCollectCallback)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  ScriptContext *this;
  undefined4 *puVar4;
  Recycler *this_00;
  ThreadContext *pTVar5;
  JavascriptExceptionObject *pJVar6;
  ThreadContext *threadContext;
  Recycler *recycler;
  ScriptContext *scriptContext;
  bool allowInObjectBeforeCollectCallback_local;
  bool verifyRuntimeState_local;
  JsrtContext *currentContext_local;
  
  if (currentContext == (JsrtContext *)0x0) {
    return JsErrorNoCurrentContext;
  }
  if (verifyRuntimeState) {
    this = JsrtContext::GetScriptContext(currentContext);
    if (this == (ScriptContext *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                         ,0x3f,"(scriptContext != nullptr)","scriptContext != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    this_00 = Js::ScriptContext::GetRecycler(this);
    pTVar5 = Js::ScriptContext::GetThreadContext(this);
    if ((this_00 != (Recycler *)0x0) &&
       (bVar2 = Memory::Recycler::IsHeapEnumInProgress(this_00), bVar2)) {
      return JsErrorHeapEnumInProgress;
    }
    if (((!allowInObjectBeforeCollectCallback) && (this_00 != (Recycler *)0x0)) &&
       (bVar2 = Memory::Recycler::IsInObjectBeforeCollectCallback(this_00), bVar2)) {
      return JsErrorInObjectBeforeCollectCallback;
    }
    bVar2 = ThreadContext::IsExecutionDisabled(pTVar5);
    if (bVar2) {
      return JsErrorInDisabledState;
    }
    BVar3 = Js::ScriptContext::IsInProfileCallback(this);
    if (BVar3 != 0) {
      return JsErrorInProfileCallback;
    }
    bVar2 = ThreadContext::IsInThreadServiceCallback(pTVar5);
    if (bVar2) {
      return JsErrorInThreadServiceCallback;
    }
    pTVar5 = Js::ScriptContext::GetThreadContext(this);
    pJVar6 = ThreadContext::GetRecordedException(pTVar5);
    if (pJVar6 != (JavascriptExceptionObject *)0x0) {
      return JsErrorInExceptionState;
    }
  }
  return JsNoError;
}

Assistant:

JsErrorCode CheckContext(JsrtContext *currentContext, bool verifyRuntimeState,
    bool allowInObjectBeforeCollectCallback)
{
    if (currentContext == nullptr)
    {
        return JsErrorNoCurrentContext;
    }

    // We don't need parameter check if it's checked in previous wrapper.
    if (verifyRuntimeState)
    {
        Js::ScriptContext *scriptContext = currentContext->GetScriptContext();
        Assert(scriptContext != nullptr);
        Recycler *recycler = scriptContext->GetRecycler();
        ThreadContext *threadContext = scriptContext->GetThreadContext();

        if (recycler && recycler->IsHeapEnumInProgress())
        {
            return JsErrorHeapEnumInProgress;
        }
        else if (!allowInObjectBeforeCollectCallback &&
            recycler && recycler->IsInObjectBeforeCollectCallback())
        {
            return JsErrorInObjectBeforeCollectCallback;
        }
        else if (threadContext->IsExecutionDisabled())
        {
            return JsErrorInDisabledState;
        }
        else if (scriptContext->IsInProfileCallback())
        {
            return JsErrorInProfileCallback;
        }
        else if (threadContext->IsInThreadServiceCallback())
        {
            return JsErrorInThreadServiceCallback;
        }

        // Make sure we don't have an outstanding exception.
        if (scriptContext->GetThreadContext()->GetRecordedException() != nullptr)
        {
            return JsErrorInExceptionState;
        }
    }

    return JsNoError;
}